

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

void __thiscall pstack::Exception::Exception(Exception *this,Exception *rhs)

{
  string local_38 [32];
  Exception *local_18;
  Exception *rhs_local;
  Exception *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__Exception_002f20d8;
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->str,local_38,0x10);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::string((string *)&this->intermediate);
  return;
}

Assistant:

Exception(const Exception &rhs) noexcept : str{ rhs.str.str() } {}